

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LdConfigDirWrapper.cpp
# Opt level: O1

void * __thiscall
LdConfigEntryWrapper::getFieldPtr(LdConfigEntryWrapper *this,size_t fieldId,size_t subField)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *pvVar2;
  
  iVar1 = (*(this->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
            _vptr_AbstractByteBuffer[0xc])();
  pvVar2 = (void *)CONCAT44(extraout_var,iVar1);
  if (pvVar2 != (void *)0x0) {
    if (fieldId == 0xffffffffffffffff) {
      return pvVar2;
    }
    iVar1 = (*(this->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
              _vptr_AbstractByteBuffer[0xf])(this);
    if (fieldId < CONCAT44(extraout_var_00,iVar1)) {
      if (fieldId == 0) {
        return pvVar2;
      }
      return (void *)((long)pvVar2 + 4);
    }
  }
  return (void *)0x0;
}

Assistant:

void* LdConfigEntryWrapper::getFieldPtr(size_t fieldId, size_t subField)
{
    void* ptr = getPtr();
    if (!ptr) return NULL;

    if (fieldId == NONE) {
        return ptr;
    }
    size_t counter = getFieldsCount();
    if (fieldId >= counter) return NULL;
    if (fieldId == HANDLER_ADDR) {
        return ptr;
    }
    return (void*)((ULONGLONG)ptr + sizeof(DWORD));
}